

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netlist.cpp
# Opt level: O3

vector<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_> *
expandVarDecl(vector<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>
              *__return_storage_ptr__,NetlistVariableDeclaration *node)

{
  pointer ppNVar1;
  iterator __begin2;
  pointer ppNVar2;
  NetlistVariableDeclaration *local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppNVar2 = (node->aliases).
            super__Vector_base<netlist::NetlistVariableAlias_*,_std::allocator<netlist::NetlistVariableAlias_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppNVar1 = (node->aliases).
            super__Vector_base<netlist::NetlistVariableAlias_*,_std::allocator<netlist::NetlistVariableAlias_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppNVar2 == ppNVar1) {
    local_28 = node;
    std::vector<netlist::NetlistNode*,std::allocator<netlist::NetlistNode*>>::
    emplace_back<netlist::NetlistNode*>
              ((vector<netlist::NetlistNode*,std::allocator<netlist::NetlistNode*>> *)
               __return_storage_ptr__,(NetlistNode **)&local_28);
  }
  else {
    do {
      local_28 = (NetlistVariableDeclaration *)*ppNVar2;
      std::vector<netlist::NetlistNode*,std::allocator<netlist::NetlistNode*>>::
      emplace_back<netlist::NetlistNode*>
                ((vector<netlist::NetlistNode*,std::allocator<netlist::NetlistNode*>> *)
                 __return_storage_ptr__,(NetlistNode **)&local_28);
      ppNVar2 = ppNVar2 + 1;
    } while (ppNVar2 != ppNVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto expandVarDecl(NetlistVariableDeclaration* node) {
    std::vector<NetlistNode*> result;
    if (node->aliases.empty()) {
        result.push_back(node);
    }
    else {
        for (auto* alias : node->aliases) {
            result.push_back(alias);
        }
    }
    return result;
}